

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Port * __thiscall
kratos::Generator::port(Generator *this,Port *p,string *port_name,bool check_param)

{
  uint uVar1;
  Port *new_var;
  
  new_var = port(this,p->direction_,port_name,(p->super_Var).var_width_,&(p->super_Var).size_,
                 p->type_,(p->super_Var).is_signed_);
  (new_var->super_Var).explicit_array_ = (p->super_Var).explicit_array_;
  uVar1 = (*(p->super_Var).super_IRNode._vptr_IRNode[0x18])(p);
  (*(new_var->super_Var).super_IRNode._vptr_IRNode[0x19])(new_var,(ulong)(uVar1 & 0xff));
  Var::copy_meta_data(&p->super_Var,&new_var->super_Var,check_param);
  return new_var;
}

Assistant:

Port &Generator::port(const Port &p, const std::string &port_name, bool check_param) {
    auto &p_ =
        port(p.port_direction(), port_name, p.var_width(), p.size(), p.port_type(), p.is_signed());
    p_.set_explicit_array(p.explicit_array());
    p_.set_is_packed(p.is_packed());
    // need to copy other definition over
    p.copy_meta_data(&p_, check_param);
    return p_;
}